

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor::MergeFrom
          (BayesianProbitRegressor *this,BayesianProbitRegressor *from)

{
  bool bVar1;
  uint32_t uVar2;
  LogMessage *other;
  ulong uVar3;
  BayesianProbitRegressor *pBVar4;
  Arena *pAVar5;
  string *psVar6;
  BayesianProbitRegressor_Gaussian *this_00;
  BayesianProbitRegressor_Gaussian *from_00;
  LogFinisher local_e5;
  uint32_t cached_has_bits;
  byte local_d1;
  LogMessage local_d0;
  BayesianProbitRegressor *local_98;
  BayesianProbitRegressor *from_local;
  BayesianProbitRegressor *this_local;
  BayesianProbitRegressor *local_80;
  string *local_78;
  BayesianProbitRegressor *local_70;
  string *local_68;
  BayesianProbitRegressor *local_60;
  string *local_58;
  BayesianProbitRegressor *local_50;
  string *local_48;
  BayesianProbitRegressor *local_40;
  string *local_38;
  BayesianProbitRegressor *local_30;
  string *local_28;
  BayesianProbitRegressor *local_20;
  string *local_18;
  BayesianProbitRegressor *local_10;
  
  local_d1 = 0;
  local_98 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x50c);
    local_d1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_d0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_e5,other);
  }
  if ((local_d1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_d0);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
  MergeFrom(&this->features_,&local_98->features_);
  _internal_regressioninputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pBVar4 = (BayesianProbitRegressor *)_internal_regressioninputfeaturename_abi_cxx11_(local_98);
    this_local = pBVar4;
    local_80 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->regressioninputfeaturename_,pBVar4,pAVar5);
  }
  _internal_optimisminputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_optimisminputfeaturename_abi_cxx11_(local_98);
    local_78 = psVar6;
    local_70 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->optimisminputfeaturename_,psVar6,pAVar5);
  }
  _internal_samplingscaleinputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_samplingscaleinputfeaturename_abi_cxx11_(local_98);
    local_68 = psVar6;
    local_60 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingscaleinputfeaturename_,psVar6,pAVar5);
  }
  _internal_samplingtruncationinputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_samplingtruncationinputfeaturename_abi_cxx11_(local_98);
    local_58 = psVar6;
    local_50 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingtruncationinputfeaturename_,psVar6,pAVar5);
  }
  _internal_meanoutputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_meanoutputfeaturename_abi_cxx11_(local_98);
    local_48 = psVar6;
    local_40 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->meanoutputfeaturename_,psVar6,pAVar5);
  }
  _internal_varianceoutputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_varianceoutputfeaturename_abi_cxx11_(local_98);
    local_38 = psVar6;
    local_30 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->varianceoutputfeaturename_,psVar6,pAVar5)
    ;
  }
  _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(local_98);
    local_28 = psVar6;
    local_20 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->pessimisticprobabilityoutputfeaturename_,psVar6,pAVar5);
  }
  _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(local_98);
    local_18 = psVar6;
    local_10 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->sampledprobabilityoutputfeaturename_,psVar6,pAVar5);
  }
  bVar1 = _internal_has_bias(local_98);
  if (bVar1) {
    this_00 = _internal_mutable_bias(this);
    from_00 = _internal_bias(local_98);
    BayesianProbitRegressor_Gaussian::MergeFrom(this_00,from_00);
  }
  uVar2 = _internal_numberoffeatures(local_98);
  if (uVar2 != 0) {
    uVar2 = _internal_numberoffeatures(local_98);
    _internal_set_numberoffeatures(this,uVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_98->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor::MergeFrom(const BayesianProbitRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  features_.MergeFrom(from.features_);
  if (!from._internal_regressioninputfeaturename().empty()) {
    _internal_set_regressioninputfeaturename(from._internal_regressioninputfeaturename());
  }
  if (!from._internal_optimisminputfeaturename().empty()) {
    _internal_set_optimisminputfeaturename(from._internal_optimisminputfeaturename());
  }
  if (!from._internal_samplingscaleinputfeaturename().empty()) {
    _internal_set_samplingscaleinputfeaturename(from._internal_samplingscaleinputfeaturename());
  }
  if (!from._internal_samplingtruncationinputfeaturename().empty()) {
    _internal_set_samplingtruncationinputfeaturename(from._internal_samplingtruncationinputfeaturename());
  }
  if (!from._internal_meanoutputfeaturename().empty()) {
    _internal_set_meanoutputfeaturename(from._internal_meanoutputfeaturename());
  }
  if (!from._internal_varianceoutputfeaturename().empty()) {
    _internal_set_varianceoutputfeaturename(from._internal_varianceoutputfeaturename());
  }
  if (!from._internal_pessimisticprobabilityoutputfeaturename().empty()) {
    _internal_set_pessimisticprobabilityoutputfeaturename(from._internal_pessimisticprobabilityoutputfeaturename());
  }
  if (!from._internal_sampledprobabilityoutputfeaturename().empty()) {
    _internal_set_sampledprobabilityoutputfeaturename(from._internal_sampledprobabilityoutputfeaturename());
  }
  if (from._internal_has_bias()) {
    _internal_mutable_bias()->::CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom(from._internal_bias());
  }
  if (from._internal_numberoffeatures() != 0) {
    _internal_set_numberoffeatures(from._internal_numberoffeatures());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}